

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_version_details.c
# Opt level: O0

char * archive_libzstd_version(void)

{
  char *pcVar1;
  
  pcVar1 = (char *)ZSTD_versionString();
  return pcVar1;
}

Assistant:

const char *
archive_libzstd_version(void)
{
#if HAVE_ZSTD_H && HAVE_LIBZSTD
#if ZSTD_VERSION_NUMBER > 10300
	return ZSTD_versionString();
#else
	div_t major = div(ZSTD_versionNumber(), 10000);
	div_t minor = div(major.rem, 100);
	static char zstd_version[9];
	snprintf(zstd_version, 9, "%d.%d.%d", major.quot, minor.quot, minor.rem);
	return zstd_version;
#endif
#else
	return NULL;
#endif
}